

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::BinaryExpression::fromComponents
          (Expression *lhs,Expression *rhs,BinaryOperator op,SourceRange opRange,
          SourceRange sourceRange,ASTContext *context)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange sourceRange_00;
  SourceRange opRange_00;
  SourceRange opRange_01;
  SourceRange opRange_02;
  SourceRange opRange_03;
  SourceRange opRange_04;
  SourceRange opRange_05;
  SourceRange opRange_06;
  SourceRange opRange_07;
  bool bVar1;
  Type *pTVar2;
  Type *this;
  undefined8 in_RCX;
  uint in_EDX;
  size_t in_R8;
  SourceLocation in_R9;
  anon_class_64_8_451f4118 checkTypes;
  Type *crt;
  Type *clt;
  Diagnostic *diag;
  bool isWildcard;
  bool isContext;
  Type *nt_1;
  Type *nt;
  bool good;
  anon_class_1_0_00000001 singleBitType;
  anon_class_1_0_00000001 forceFourState;
  bool bothStrings;
  bool bothNumeric;
  bool bothIntegral;
  BinaryExpression *result;
  Type *rt;
  Type *lt;
  Compilation *compilation;
  undefined4 uVar3;
  Compilation *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  SourceLocation in_stack_fffffffffffffca0;
  ASTContext *in_stack_fffffffffffffca8;
  undefined6 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb6;
  undefined1 in_stack_fffffffffffffcb7;
  SourceLocation in_stack_fffffffffffffcb8;
  Type *in_stack_fffffffffffffcc0;
  Compilation *in_stack_fffffffffffffcc8;
  BinaryExpression *pBVar4;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  Type *in_stack_fffffffffffffcd8;
  Diagnostic *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  SourceLocation in_stack_fffffffffffffcf0;
  ConversionKind conversionKind;
  SourceRange *in_stack_fffffffffffffd00;
  undefined5 in_stack_fffffffffffffd10;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  ASTContext *this_00;
  Type *in_stack_fffffffffffffd40;
  DiagCode code;
  Type *in_stack_fffffffffffffd48;
  Type *local_230;
  not_null<const_slang::ast::Type_*> local_228;
  Type *local_220;
  not_null<const_slang::ast::Type_*> local_218;
  Type *local_210;
  not_null<const_slang::ast::Type_*> local_208;
  Type *local_200;
  not_null<const_slang::ast::Type_*> local_1f8;
  Type *local_1f0;
  not_null<const_slang::ast::Type_*> local_1e8;
  Type *local_1e0;
  not_null<const_slang::ast::Type_*> local_1d8;
  Type *local_1d0;
  not_null<const_slang::ast::Type_*> local_1c8;
  undefined1 local_1c0 [24];
  size_t local_1a8;
  Type *local_1a0;
  not_null<const_slang::ast::Type_*> local_198;
  byte local_18a;
  byte local_189;
  undefined1 local_188 [24];
  size_t local_170;
  Type *local_168;
  Type *local_160;
  not_null<const_slang::ast::Type_*> local_158;
  Type *local_150;
  not_null<const_slang::ast::Type_*> local_148;
  Type *local_140;
  not_null<const_slang::ast::Type_*> local_138;
  Type *local_130;
  not_null<const_slang::ast::Type_*> local_128 [2];
  size_t local_118;
  SymbolKind local_110;
  undefined4 uStack_10c;
  undefined8 in_stack_fffffffffffffef8;
  size_t sVar8;
  BinaryOperator op_00;
  Diagnostic *in_stack_ffffffffffffff00;
  Type *in_stack_ffffffffffffff08;
  not_null<const_slang::ast::Type_*> in_stack_ffffffffffffff10;
  SourceLocation in_stack_ffffffffffffff18;
  not_null<const_slang::ast::Type_*> in_stack_ffffffffffffff20;
  Type *local_c8;
  not_null<const_slang::ast::Type_*> local_c0;
  not_null<const_slang::ast::Type_*> local_b8;
  Type *local_b0;
  not_null<const_slang::ast::Type_*> local_a8;
  Type *local_a0;
  not_null<const_slang::ast::Type_*> local_98;
  Type *local_90;
  not_null<const_slang::ast::Type_*> local_88;
  Type *local_80;
  not_null<const_slang::ast::Type_*> local_78;
  Type *local_70;
  not_null<const_slang::ast::Type_*> local_68;
  byte local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  byte local_5a;
  byte local_59;
  BinaryExpression *local_58;
  Type *local_50;
  Type *local_48;
  Compilation *local_40;
  SourceLocation local_38;
  uint local_2c;
  SymbolKind local_18;
  undefined4 uStack_14;
  size_t local_10;
  BinaryExpression *local_8;
  
  op_00 = (BinaryOperator)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  this_00 = (ASTContext *)&stack0x00000008;
  local_38 = in_R9;
  local_2c = in_EDX;
  _local_18 = in_RCX;
  local_10 = in_R8;
  local_40 = ASTContext::getCompilation((ASTContext *)0xbcd003);
  local_48 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0xbcd01c);
  local_50 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0xbcd035);
  pTVar2 = (Type *)&stack0xffffffffffffffe8;
  local_58 = BumpAllocator::
             emplace<slang::ast::BinaryExpression,slang::ast::BinaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&,slang::SourceRange&>
                       ((BumpAllocator *)in_stack_fffffffffffffcf0,
                        (BinaryOperator *)
                        CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                        (Type *)in_stack_fffffffffffffce0,(Expression *)in_stack_fffffffffffffcd8,
                        (Expression *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                        (SourceRange *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffd00);
  conversionKind = (ConversionKind)in_stack_fffffffffffffd00;
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffc90);
  if ((bVar1) || (bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffc90), bVar1)) {
    local_8 = (BinaryExpression *)
              Expression::badExpr(in_stack_fffffffffffffc90,(Expression *)pTVar2);
  }
  else {
    bVar1 = Type::isUnbounded((Type *)0xbcd0d9);
    if (bVar1) {
      local_48 = Compilation::getIntType(local_40);
    }
    bVar1 = Type::isUnbounded((Type *)0xbcd101);
    if (bVar1) {
      local_50 = Compilation::getIntType(local_40);
    }
    bVar1 = Type::isIntegral((Type *)in_stack_fffffffffffffc90);
    uVar7 = false;
    if (bVar1) {
      uVar7 = Type::isIntegral((Type *)in_stack_fffffffffffffc90);
    }
    local_59 = uVar7;
    bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffffc90);
    uVar6 = false;
    if (bVar1) {
      uVar6 = Type::isNumeric((Type *)in_stack_fffffffffffffc90);
    }
    local_5a = uVar6;
    bVar1 = Expression::isImplicitString((Expression *)this_00);
    uVar5 = false;
    if (bVar1) {
      uVar5 = Expression::isImplicitString((Expression *)this_00);
    }
    local_5c = 0;
    local_5d = 0;
    local_5e = 0;
    local_5b = uVar5;
    switch(local_2c) {
    case 0:
    case 1:
    case 2:
      local_5e = local_5a & 1;
      local_70 = OpInfo::binaryType(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                    (Type *)in_stack_fffffffffffffcb8,
                                    (bool)in_stack_fffffffffffffcb7,(bool)in_stack_fffffffffffffcb6)
      ;
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_68,&local_70);
      (local_58->super_Expression).type.ptr = local_68.ptr;
      break;
    case 3:
      local_5e = local_5a & 1;
      local_80 = OpInfo::binaryType(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                    (Type *)in_stack_fffffffffffffcb8,
                                    (bool)in_stack_fffffffffffffcb7,(bool)in_stack_fffffffffffffcb6)
      ;
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_78,&local_80);
      (local_58->super_Expression).type.ptr = local_78.ptr;
      break;
    case 4:
      local_5e = local_59 & 1;
      local_90 = OpInfo::binaryType(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                    (Type *)in_stack_fffffffffffffcb8,
                                    (bool)in_stack_fffffffffffffcb7,(bool)in_stack_fffffffffffffcb6)
      ;
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_88,&local_90);
      (local_58->super_Expression).type.ptr = local_88.ptr;
      break;
    case 5:
    case 6:
    case 7:
    case 8:
      local_5e = local_59 & 1;
      local_a0 = OpInfo::binaryType(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                    (Type *)in_stack_fffffffffffffcb8,
                                    (bool)in_stack_fffffffffffffcb7,(bool)in_stack_fffffffffffffcb6)
      ;
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_98,&local_a0);
      (local_58->super_Expression).type.ptr = local_98.ptr;
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0x11:
    case 0x12:
      if ((local_5a & 1) == 0) {
        local_189 = 0;
        uVar7 = local_2c == 0x11 || local_2c == 0x12;
        local_18a = uVar7;
        if ((bool)uVar5 == false) {
          bVar1 = Type::isAggregate(pTVar2);
          if ((bVar1) &&
             (bVar1 = Type::isEquivalent((Type *)CONCAT17(in_stack_fffffffffffffcef,
                                                          in_stack_fffffffffffffce8),
                                         (Type *)in_stack_fffffffffffffce0), bVar1)) {
            local_5e = (local_18a ^ 0xff) & 1;
            local_1d0 = fromComponents::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)
                                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                   in_stack_fffffffffffffc90,pTVar2,(Type *)0xbcdcf1);
            not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                      (&local_1c8,&local_1d0);
            (local_58->super_Expression).type.ptr = local_1c8.ptr;
          }
          else {
            bVar1 = Type::isClass((Type *)0xbcdd34);
            if (((bVar1) &&
                (bVar1 = Type::isAssignmentCompatible
                                   ((Type *)CONCAT17(in_stack_fffffffffffffcef,
                                                     in_stack_fffffffffffffce8),
                                    (Type *)in_stack_fffffffffffffce0), bVar1)) ||
               ((bVar1 = Type::isClass((Type *)0xbcdd60), bVar1 &&
                (bVar1 = Type::isAssignmentCompatible
                                   ((Type *)CONCAT17(in_stack_fffffffffffffcef,
                                                     in_stack_fffffffffffffce8),
                                    (Type *)in_stack_fffffffffffffce0), bVar1)))) {
              local_5e = 1;
              local_1e0 = Compilation::getBitType(local_40);
              not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                        (&local_1d8,&local_1e0);
              (local_58->super_Expression).type.ptr = local_1d8.ptr;
            }
            else {
              bVar1 = Type::isCHandle((Type *)0xbcddd9);
              if (((bVar1) || (bVar1 = Type::isNull((Type *)0xbcddea), bVar1)) &&
                 ((bVar1 = Type::isCHandle((Type *)0xbcddfd), bVar1 ||
                  (bVar1 = Type::isNull((Type *)0xbcde0e), bVar1)))) {
                local_5e = 1;
                local_1f0 = Compilation::getBitType(local_40);
                not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                          (&local_1e8,&local_1f0);
                (local_58->super_Expression).type.ptr = local_1e8.ptr;
              }
              else {
                bVar1 = Type::isEvent((Type *)0xbcde6c);
                if (((bVar1) || (bVar1 = Type::isNull((Type *)0xbcde7d), bVar1)) &&
                   ((bVar1 = Type::isEvent((Type *)0xbcde90), bVar1 ||
                    (bVar1 = Type::isNull((Type *)0xbcdea1), bVar1)))) {
                  local_5e = 1;
                  local_200 = Compilation::getBitType(local_40);
                  not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                            (&local_1f8,&local_200);
                  (local_58->super_Expression).type.ptr = local_1f8.ptr;
                }
                else {
                  bVar1 = Type::isCovergroup((Type *)0xbcdeff);
                  if (((bVar1) || (bVar1 = Type::isNull((Type *)0xbcdf10), bVar1)) &&
                     ((bVar1 = Type::isCovergroup((Type *)0xbcdf23), bVar1 ||
                      (bVar1 = Type::isNull((Type *)0xbcdf34), bVar1)))) {
                    local_5e = 1;
                    local_210 = Compilation::getBitType(local_40);
                    not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                              (&local_208,&local_210);
                    (local_58->super_Expression).type.ptr = local_208.ptr;
                  }
                  else {
                    bVar1 = Type::isVirtualInterface((Type *)0xbcdf92);
                    if (((bVar1) &&
                        (bVar1 = Type::isAssignmentCompatible
                                           ((Type *)CONCAT17(in_stack_fffffffffffffcef,
                                                             in_stack_fffffffffffffce8),
                                            (Type *)in_stack_fffffffffffffce0), bVar1)) ||
                       ((bVar1 = Type::isVirtualInterface((Type *)0xbcdfbe), bVar1 &&
                        (bVar1 = Type::isAssignmentCompatible
                                           ((Type *)CONCAT17(in_stack_fffffffffffffcef,
                                                             in_stack_fffffffffffffce8),
                                            (Type *)in_stack_fffffffffffffce0), bVar1)))) {
                      local_5e = 1;
                      local_220 = Compilation::getBitType(local_40);
                      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                                (&local_218,&local_220);
                      (local_58->super_Expression).type.ptr = local_218.ptr;
                    }
                    else {
                      bVar1 = Type::isTypeRefType((Type *)0xbce037);
                      if ((bVar1) && (bVar1 = Type::isTypeRefType((Type *)0xbce04a), bVar1)) {
                        local_5e = (local_18a ^ 0xff) & 1;
                        local_230 = Compilation::getBitType(local_40);
                        not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                                  (&local_228,&local_230);
                        (local_58->super_Expression).type.ptr = local_228.ptr;
                      }
                      else {
                        local_5e = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          local_5e = (uVar7 ^ 0xff) & 1;
          local_1a0 = Compilation::getBitType(local_40);
          uVar3 = (undefined4)((ulong)pTVar2 >> 0x20);
          not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                    (&local_198,&local_1a0);
          (local_58->super_Expression).type.ptr = local_198.ptr;
          local_189 = 1;
          in_stack_fffffffffffffca8 = (ASTContext *)&local_58->left_;
          in_stack_fffffffffffffcb0 = SUB86(local_58,0);
          in_stack_fffffffffffffcb6 = (undefined1)((ulong)local_58 >> 0x30);
          in_stack_fffffffffffffcb7 = (undefined1)((ulong)local_58 >> 0x38);
          in_stack_fffffffffffffca0 = local_38;
          Compilation::getStringType(local_40);
          local_1c0._16_8_ = _local_18;
          local_1a8 = local_10;
          opRange_05.startLoc._7_1_ = in_stack_fffffffffffffcef;
          opRange_05.startLoc._0_7_ = in_stack_fffffffffffffce8;
          opRange_05.endLoc = in_stack_fffffffffffffcf0;
          Expression::contextDetermined
                    ((ASTContext *)in_stack_fffffffffffffce0,
                     (Expression **)in_stack_fffffffffffffcd8,
                     (Expression *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),
                     (Type *)in_stack_fffffffffffffcc8,opRange_05,conversionKind);
          in_stack_fffffffffffffcc0 = (Type *)&local_58->right_;
          pBVar4 = local_58;
          Compilation::getStringType(local_40);
          local_1c0._0_8_ = _local_18;
          local_1c0._8_8_ = local_10;
          pTVar2 = (Type *)CONCAT44(uVar3,1);
          opRange_06.startLoc._7_1_ = in_stack_fffffffffffffcef;
          opRange_06.startLoc._0_7_ = in_stack_fffffffffffffce8;
          opRange_06.endLoc = in_stack_fffffffffffffcf0;
          Expression::contextDetermined
                    ((ASTContext *)in_stack_fffffffffffffce0,
                     (Expression **)in_stack_fffffffffffffcd8,
                     (Expression *)CONCAT17(uVar7,in_stack_fffffffffffffcd0),(Type *)pBVar4,
                     opRange_06,conversionKind);
          in_stack_fffffffffffffcb8 = local_38;
        }
        if ((local_189 & 1) == 0) {
          Expression::selfDetermined
                    ((ASTContext *)in_stack_fffffffffffffce0,
                     (Expression **)in_stack_fffffffffffffcd8);
          Expression::selfDetermined
                    ((ASTContext *)in_stack_fffffffffffffce0,
                     (Expression **)in_stack_fffffffffffffcd8);
        }
      }
      else {
        if ((local_2c == 9) || (local_2c == 10)) {
          local_5e = 1;
          local_140 = fromComponents::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                 in_stack_fffffffffffffc90,pTVar2,(Type *)0xbcd8db);
          uVar3 = (undefined4)((ulong)pTVar2 >> 0x20);
          not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                    (&local_138,&local_140);
          (local_58->super_Expression).type.ptr = local_138.ptr;
        }
        else if ((local_2c == 0xb) || (local_2c == 0xc)) {
          local_5e = 1;
          local_150 = Compilation::getBitType(local_40);
          uVar3 = (undefined4)((ulong)pTVar2 >> 0x20);
          not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                    (&local_148,&local_150);
          (local_58->super_Expression).type.ptr = local_148.ptr;
        }
        else {
          local_5e = local_59 & 1;
          bVar1 = Type::isFourState((Type *)CONCAT17(in_stack_fffffffffffffcef,
                                                     in_stack_fffffffffffffce8));
          uVar3 = (undefined4)((ulong)pTVar2 >> 0x20);
          if (bVar1) {
            in_stack_fffffffffffffcd8 = Compilation::getLogicType(local_40);
          }
          else {
            in_stack_fffffffffffffcd8 = Compilation::getBitType(local_40);
          }
          local_160 = in_stack_fffffffffffffcd8;
          not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                    (&local_158,&local_160);
          (local_58->super_Expression).type.ptr = local_158.ptr;
        }
        local_168 = OpInfo::binaryType(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                       (Type *)in_stack_fffffffffffffcb8,
                                       (bool)in_stack_fffffffffffffcb7,
                                       (bool)in_stack_fffffffffffffcb6);
        local_188._16_8_ = _local_18;
        local_170 = local_10;
        opRange_03.startLoc._7_1_ = in_stack_fffffffffffffcef;
        opRange_03.startLoc._0_7_ = in_stack_fffffffffffffce8;
        opRange_03.endLoc = in_stack_fffffffffffffcf0;
        Expression::contextDetermined
                  ((ASTContext *)in_stack_fffffffffffffce0,(Expression **)in_stack_fffffffffffffcd8,
                   (Expression *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                   (Type *)in_stack_fffffffffffffcc8,opRange_03,conversionKind);
        local_188._0_8_ = _local_18;
        local_188._8_8_ = local_10;
        pTVar2 = (Type *)CONCAT44(uVar3,1);
        opRange_04.startLoc._7_1_ = in_stack_fffffffffffffcef;
        opRange_04.startLoc._0_7_ = in_stack_fffffffffffffce8;
        opRange_04.endLoc = in_stack_fffffffffffffcf0;
        Expression::contextDetermined
                  ((ASTContext *)in_stack_fffffffffffffce0,(Expression **)in_stack_fffffffffffffcd8,
                   (Expression *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                   (Type *)in_stack_fffffffffffffcc8,opRange_04,conversionKind);
      }
      break;
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
      uVar7 = true;
      if ((local_5a & 1) == 0) {
        uVar7 = uVar5;
      }
      local_5e = uVar7;
      in_stack_ffffffffffffff08 =
           fromComponents::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)
                      CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                      in_stack_fffffffffffffc90,pTVar2,(Type *)0xbcd660);
      uVar3 = (undefined4)((ulong)pTVar2 >> 0x20);
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                ((not_null<const_slang::ast::Type_*> *)&stack0xffffffffffffff10,
                 (Type **)&stack0xffffffffffffff08);
      (local_58->super_Expression).type.ptr = in_stack_ffffffffffffff10.ptr;
      if (((local_5e & 1) == 0) || ((local_5a & 1) != 0)) {
        in_stack_fffffffffffffce0 =
             (Diagnostic *)
             OpInfo::binaryType(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                (Type *)in_stack_fffffffffffffcb8,(bool)in_stack_fffffffffffffcb7,
                                (bool)in_stack_fffffffffffffcb6);
      }
      else {
        in_stack_fffffffffffffce0 = (Diagnostic *)Compilation::getStringType(local_40);
      }
      local_110 = local_18;
      uStack_10c = uStack_14;
      opRange_01.startLoc._7_1_ = uVar7;
      opRange_01.startLoc._0_7_ = in_stack_fffffffffffffce8;
      opRange_01.endLoc = in_stack_fffffffffffffcf0;
      sVar8 = local_10;
      in_stack_ffffffffffffff00 = in_stack_fffffffffffffce0;
      Expression::contextDetermined
                ((ASTContext *)in_stack_fffffffffffffce0,(Expression **)in_stack_fffffffffffffcd8,
                 (Expression *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 (Type *)in_stack_fffffffffffffcc8,opRange_01,conversionKind);
      op_00 = (BinaryOperator)(sVar8 >> 0x20);
      local_128[1].ptr = (Type *)_local_18;
      local_118 = local_10;
      pTVar2 = (Type *)CONCAT44(uVar3,1);
      opRange_02.startLoc._7_1_ = uVar7;
      opRange_02.startLoc._0_7_ = in_stack_fffffffffffffce8;
      opRange_02.endLoc = in_stack_fffffffffffffcf0;
      Expression::contextDetermined
                ((ASTContext *)in_stack_fffffffffffffce0,(Expression **)in_stack_fffffffffffffcd8,
                 (Expression *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                 (Type *)in_stack_fffffffffffffcc8,opRange_02,conversionKind);
      break;
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
      local_5e = local_5a & 1;
      local_130 = fromComponents::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)
                             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                             in_stack_fffffffffffffc90,pTVar2,(Type *)0xbcd7e8);
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(local_128,&local_130);
      (local_58->super_Expression).type.ptr = local_128[0].ptr;
      Expression::selfDetermined
                ((ASTContext *)in_stack_fffffffffffffce0,(Expression **)in_stack_fffffffffffffcd8);
      Expression::selfDetermined
                ((ASTContext *)in_stack_fffffffffffffce0,(Expression **)in_stack_fffffffffffffcd8);
      if ((local_5e & 1) != 0) {
        ASTContext::requireBooleanConvertible
                  (this_00,(Expression *)
                           CONCAT17(uVar7,CONCAT16(uVar6,CONCAT15(uVar5,in_stack_fffffffffffffd10)))
                  );
        ASTContext::requireBooleanConvertible
                  (this_00,(Expression *)
                           CONCAT17(uVar7,CONCAT16(uVar6,CONCAT15(uVar5,in_stack_fffffffffffffd10)))
                  );
      }
      break;
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
      local_5e = local_59 & 1;
      bVar1 = Type::isFourState((Type *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8
                                                ));
      if (bVar1) {
        local_b0 = fromComponents::anon_class_1_0_00000001::operator()
                             ((anon_class_1_0_00000001 *)
                              CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                              in_stack_fffffffffffffc90,pTVar2);
        not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_a8,&local_b0);
        (local_58->super_Expression).type.ptr = local_a8.ptr;
      }
      else {
        not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*&>(&local_b8,&local_48)
        ;
        (local_58->super_Expression).type.ptr = local_b8.ptr;
      }
      Expression::selfDetermined
                ((ASTContext *)in_stack_fffffffffffffce0,(Expression **)in_stack_fffffffffffffcd8);
      break;
    case 0x1b:
      local_5e = local_5a & 1;
      bVar1 = Type::isFloating((Type *)0xbcd4ad);
      if ((bVar1) || (bVar1 = Type::isFloating((Type *)0xbcd4be), bVar1)) {
        uVar3 = (undefined4)((ulong)pTVar2 >> 0x20);
        local_c8 = OpInfo::binaryType(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                      (Type *)in_stack_fffffffffffffcb8,
                                      (bool)in_stack_fffffffffffffcb7,
                                      (bool)in_stack_fffffffffffffcb6);
        not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_c0,&local_c8);
        (local_58->super_Expression).type.ptr = local_c0.ptr;
        pBVar4 = local_58;
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0xbcd557);
        pTVar2 = (Type *)CONCAT44(uVar3,1);
        opRange_00.startLoc._7_1_ = in_stack_fffffffffffffcef;
        opRange_00.startLoc._0_7_ = in_stack_fffffffffffffce8;
        opRange_00.endLoc = local_38;
        Expression::contextDetermined
                  ((ASTContext *)in_stack_fffffffffffffce0,(Expression **)in_stack_fffffffffffffcd8,
                   (Expression *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                   (Type *)in_stack_fffffffffffffcc8,opRange_00,(ConversionKind)pBVar4);
      }
      else {
        in_stack_ffffffffffffff18 =
             (SourceLocation)
             fromComponents::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)
                        CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                        in_stack_fffffffffffffc90,pTVar2);
        not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                  ((not_null<const_slang::ast::Type_*> *)&stack0xffffffffffffff20,
                   (Type **)&stack0xffffffffffffff18);
        (local_58->super_Expression).type.ptr = in_stack_ffffffffffffff20.ptr;
        Expression::selfDetermined
                  ((ASTContext *)in_stack_fffffffffffffce0,(Expression **)in_stack_fffffffffffffcd8)
        ;
      }
    }
    if ((local_5e & 1) == 0) {
      sourceRange_00.startLoc._6_1_ = in_stack_fffffffffffffcb6;
      sourceRange_00.startLoc._0_6_ = in_stack_fffffffffffffcb0;
      sourceRange_00.startLoc._7_1_ = in_stack_fffffffffffffcb7;
      sourceRange_00.endLoc = in_stack_fffffffffffffcb8;
      ASTContext::addDiag(in_stack_fffffffffffffca8,
                          SUB84((ulong)in_stack_fffffffffffffcc0 >> 0x20,0),sourceRange_00);
      ast::operator<<(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      ast::operator<<(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      range.startLoc._4_4_ = in_stack_fffffffffffffc9c;
      range.startLoc._0_4_ = in_stack_fffffffffffffc98;
      range.endLoc = in_stack_fffffffffffffca0;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc90,range);
      range_00.startLoc._4_4_ = in_stack_fffffffffffffc9c;
      range_00.startLoc._0_4_ = in_stack_fffffffffffffc98;
      range_00.endLoc = in_stack_fffffffffffffca0;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffc90,range_00);
      local_8 = (BinaryExpression *)
                Expression::badExpr(in_stack_fffffffffffffc90,(Expression *)pTVar2);
    }
    else {
      opRange_07.endLoc = (SourceLocation)in_stack_ffffffffffffff20.ptr;
      opRange_07.startLoc = in_stack_ffffffffffffff18;
      analyzePrecedence((ASTContext *)in_stack_ffffffffffffff10.ptr,
                        (Expression *)in_stack_ffffffffffffff08,
                        (Expression *)in_stack_ffffffffffffff00,op_00,opRange_07);
      pTVar2 = Type::getCanonicalType((Type *)in_stack_fffffffffffffc90);
      this = Type::getCanonicalType((Type *)in_stack_fffffffffffffc90);
      bVar1 = Type::isMatching(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      if (!bVar1) {
        bVar1 = SUB81((ulong)pTVar2 >> 0x38,0);
        code = SUB84((ulong)&local_48 >> 0x20,0);
        if (local_2c < 5) {
          fromComponents::anon_class_64_8_451f4118::operator()
                    ((anon_class_64_8_451f4118 *)this,code,bVar1);
        }
        else if (local_2c - 5 < 4) {
          fromComponents::anon_class_64_8_451f4118::operator()
                    ((anon_class_64_8_451f4118 *)this,code,bVar1);
        }
        else if (local_2c - 9 < 10) {
          fromComponents::anon_class_64_8_451f4118::operator()
                    ((anon_class_64_8_451f4118 *)this,code,bVar1);
        }
      }
      local_8 = local_58;
    }
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& BinaryExpression::fromComponents(Expression& lhs, Expression& rhs, BinaryOperator op,
                                             SourceRange opRange, SourceRange sourceRange,
                                             const ASTContext& context) {
    auto& compilation = context.getCompilation();
    const Type* lt = lhs.type;
    const Type* rt = rhs.type;

    auto result = compilation.emplace<BinaryExpression>(op, *lt, lhs, rhs, sourceRange, opRange);
    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lt->isUnbounded())
        lt = &compilation.getIntType();
    if (rt->isUnbounded())
        rt = &compilation.getIntType();

    bool bothIntegral = lt->isIntegral() && rt->isIntegral();
    bool bothNumeric = lt->isNumeric() && rt->isNumeric();
    bool bothStrings = lhs.isImplicitString() && rhs.isImplicitString();

    auto forceFourState = [](Compilation& compilation, const Type* forceType) {
        if (forceType->isFloating() || forceType->isFourState())
            return forceType;

        // Use the logic in binaryOperatorType to create a type with the correct size and sign.
        return OpInfo::binaryType(compilation, forceType, forceType, true);
    };

    auto singleBitType = [](Compilation& compilation, const Type* lt, const Type* rt) {
        if (lt->isFourState() || rt->isFourState())
            return &compilation.getLogicType();
        return &compilation.getBitType();
    };

    bool good = false;
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
            good = bothNumeric;
            result->type = OpInfo::binaryType(compilation, lt, rt, false);
            break;
        case BinaryOperator::Divide:
            // Result is forced to 4-state because result can be X.
            good = bothNumeric;
            result->type = OpInfo::binaryType(compilation, lt, rt, true);
            break;
        case BinaryOperator::Mod:
            // Result is forced to 4-state because result can be X.
            // Different from divide because only integers are allowed.
            good = bothIntegral;
            result->type = OpInfo::binaryType(compilation, lt, rt, true);
            break;
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            good = bothIntegral;
            result->type = OpInfo::binaryType(compilation, lt, rt, false);
            break;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
            // The result is always the same type as the lhs, except that if the rhs is
            // four state then the lhs also becomes four state.
            good = bothIntegral;
            if (rt->isFourState())
                result->type = forceFourState(compilation, lt);
            else
                result->type = lt;
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Power:
            good = bothNumeric;
            if (lt->isFloating() || rt->isFloating()) {
                result->type = OpInfo::binaryType(compilation, lt, rt, false);
                contextDetermined(context, result->right_, result, *result->type, opRange);
            }
            else {
                // Result is forced to 4-state because result can be X.
                result->type = forceFourState(compilation, lt);
                selfDetermined(context, result->right_);
            }
            break;
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan: {
            // Result is always a single bit.
            good = bothNumeric || bothStrings;
            result->type = singleBitType(compilation, lt, rt);

            // Result type is fixed but the two operands affect each other as they would in
            // other context-determined operators.
            auto nt = (good && !bothNumeric) ? &compilation.getStringType()
                                             : OpInfo::binaryType(compilation, lt, rt, false);
            contextDetermined(context, result->left_, result, *nt, opRange);
            contextDetermined(context, result->right_, result, *nt, opRange);
            break;
        }
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            // Result is always a single bit.
            good = bothNumeric;
            result->type = singleBitType(compilation, lt, rt);
            selfDetermined(context, result->left_);
            selfDetermined(context, result->right_);
            if (good) {
                // Call this just to get warnings about boolean conversions.
                context.requireBooleanConvertible(*result->left_);
                context.requireBooleanConvertible(*result->right_);
            }
            break;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
            // Two types are comparable if:
            // - they are both integral or floating
            // - both classes or null, and assignment compatible
            // - both chandles or null
            // - both aggregates and equivalent
            if (bothNumeric) {
                // For equality and inequality, result is four state if either operand is
                // four state. For case equality and case inequality, result is never four
                // state. For wildcard equality / inequality, result is four state only if
                // lhs is four state.
                if (op == BinaryOperator::Equality || op == BinaryOperator::Inequality) {
                    good = true;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if (op == BinaryOperator::CaseEquality ||
                         op == BinaryOperator::CaseInequality) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = bothIntegral;
                    result->type = lt->isFourState() ? &compilation.getLogicType()
                                                     : &compilation.getBitType();
                }

                // Result type is fixed but the two operands affect each other as they would
                // in other context-determined operators.
                auto nt = OpInfo::binaryType(compilation, lt, rt, false);
                contextDetermined(context, result->left_, result, *nt, opRange);
                contextDetermined(context, result->right_, result, *nt, opRange);
            }
            else {
                bool isContext = false;
                bool isWildcard = op == BinaryOperator::WildcardEquality ||
                                  op == BinaryOperator::WildcardInequality;

                if (bothStrings) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();

                    // If there is a literal involved, make sure it's converted to string.
                    isContext = true;
                    contextDetermined(context, result->left_, result, compilation.getStringType(),
                                      opRange);
                    contextDetermined(context, result->right_, result, compilation.getStringType(),
                                      opRange);
                }
                else if (lt->isAggregate() && lt->isEquivalent(*rt)) {
                    good = !isWildcard;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if ((lt->isClass() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isClass() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCHandle() || lt->isNull()) && (rt->isCHandle() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isEvent() || lt->isNull()) && (rt->isEvent() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCovergroup() || lt->isNull()) &&
                         (rt->isCovergroup() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isVirtualInterface() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isVirtualInterface() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if (lt->isTypeRefType() && rt->isTypeRefType()) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = false;
                }

                if (!isContext) {
                    selfDetermined(context, result->left_);
                    selfDetermined(context, result->right_);
                }
            }
            break;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadBinaryExpression, opRange);
        diag << *lt << *rt;
        diag << lhs.sourceRange;
        diag << rhs.sourceRange;
        return badExpr(compilation, result);
    }

    analyzePrecedence(context, lhs, rhs, op, opRange);

    auto& clt = lt->getCanonicalType();
    auto& crt = rt->getCanonicalType();
    if (!clt.isMatching(crt)) {
        auto checkTypes = [&](DiagCode code, bool isComparison) {
            analyzeOpTypes(clt, crt, *lt, *rt, lhs, rhs, context, opRange, code, isComparison, {});
        };

        switch (op) {
            case BinaryOperator::Add:
            case BinaryOperator::Subtract:
            case BinaryOperator::Multiply:
            case BinaryOperator::Divide:
            case BinaryOperator::Mod:
                checkTypes(diag::ArithOpMismatch, false);
                break;
            case BinaryOperator::BinaryAnd:
            case BinaryOperator::BinaryOr:
            case BinaryOperator::BinaryXor:
            case BinaryOperator::BinaryXnor:
                checkTypes(diag::BitwiseOpMismatch, false);
                break;
            case BinaryOperator::Equality:
            case BinaryOperator::Inequality:
            case BinaryOperator::CaseEquality:
            case BinaryOperator::CaseInequality:
            case BinaryOperator::GreaterThanEqual:
            case BinaryOperator::GreaterThan:
            case BinaryOperator::LessThanEqual:
            case BinaryOperator::LessThan:
            case BinaryOperator::WildcardEquality:
            case BinaryOperator::WildcardInequality:
                checkTypes(diag::ComparisonMismatch, true);
                break;
            default:
                // Remaining operations have self determined
                // operands so the warning wouldn't make sense.
                break;
        }
    }

    return *result;
}